

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O2

void __thiscall QLineEdit::setReadOnly(QLineEdit *this,bool enable)

{
  QLineEditPrivate *this_00;
  bool enabled;
  long in_FS_OFFSET;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QCursor local_50;
  undefined8 local_48;
  QLineEdit *pQStack_40;
  undefined8 local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  if ((bool)((this_00->control->field_0x50 & 4) >> 2) != enable) {
    QWidgetLineControl::setReadOnly((QWidgetLineControl *)this_00->control,enable);
    enabled = !enable;
    QLineEditPrivate::setClearButtonEnabled(this_00,enabled);
    QWidget::setAttribute(&this->super_QWidget,WA_MacShowFocusRect,enabled);
    QWidget::setAttribute
              (&this->super_QWidget,WA_InputMethodEnabled,
               (*(ushort *)&this_00->control->field_0x50 & 4) == 0);
    QCursor::QCursor(&local_50,(uint)enabled << 2);
    QWidget::setCursor(&this->super_QWidget,&local_50);
    QCursor::~QCursor(&local_50);
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_68,ReadOnlyChange);
    QCoreApplication::sendEvent((QObject *)this,(QEvent *)&local_68);
    QWidget::update(&this->super_QWidget);
    local_38 = 0xaaaaaaaaffffffff;
    local_50.d = (QCursorData *)QCss::ValueExtractor::extractGeometry;
    local_30 = 0x100;
    local_48 = 0xaaaaaaaa0000800a;
    pQStack_40 = this;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_50);
    QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent
              ((QAccessibleStateChangeEvent *)&local_50);
    QEvent::~QEvent((QEvent *)&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEdit::setReadOnly(bool enable)
{
    Q_D(QLineEdit);
    if (d->control->isReadOnly() != enable) {
        d->control->setReadOnly(enable);
        d->setClearButtonEnabled(!enable);
        setAttribute(Qt::WA_MacShowFocusRect, !enable);
        setAttribute(Qt::WA_InputMethodEnabled, d->shouldEnableInputMethod());
#ifndef QT_NO_CURSOR
        setCursor(enable ? Qt::ArrowCursor : Qt::IBeamCursor);
#endif
        QEvent event(QEvent::ReadOnlyChange);
        QCoreApplication::sendEvent(this, &event);
        update();
#if QT_CONFIG(accessibility)
        QAccessible::State changedState;
        changedState.readOnly = true;
        QAccessibleStateChangeEvent ev(this, changedState);
        QAccessible::updateAccessibility(&ev);
#endif
    }
}